

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

void __thiscall Parser::AddFastScannedRegExpNode(Parser *this,ParseNodePtr pnode)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  NodeDList *this_00;
  ParseNodePtr local_20;
  ParseNodePtr pnode_local;
  
  local_20 = pnode;
  if (this->m_isInBackground == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x3061,"(!IsBackgroundParser())","!IsBackgroundParser()");
    if (!bVar2) goto LAB_00cec063;
    *puVar3 = 0;
  }
  if (this->m_doingFastScan == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x3062,"(m_doingFastScan)","m_doingFastScan");
    if (!bVar2) {
LAB_00cec063:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = this->fastScannedRegExpNodes;
  if (this_00 == (NodeDList *)0x0) {
    this_00 = (NodeDList *)new<Memory::ArenaAllocator>(0x20,&this->m_nodeAllocator,0x35916e);
    (this_00->super_DListBase<ParseNode_*,_RealCount>).super_DListNodeBase<ParseNode_*>.next.node =
         (DListNode<ParseNode_*> *)this_00;
    (this_00->super_DListBase<ParseNode_*,_RealCount>).super_DListNodeBase<ParseNode_*>.prev.list =
         (DListBase<ParseNode_*,_RealCount> *)this_00;
    (this_00->super_DListBase<ParseNode_*,_RealCount>).super_RealCount.count = 0;
    this_00->allocator = &this->m_nodeAllocator;
    this->fastScannedRegExpNodes = this_00;
  }
  DList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Append(this_00,&local_20);
  return;
}

Assistant:

void Parser::AddFastScannedRegExpNode(ParseNodePtr const pnode)
{
    Assert(!IsBackgroundParser());
    Assert(m_doingFastScan);

    if (fastScannedRegExpNodes == nullptr)
    {
        fastScannedRegExpNodes = Anew(&m_nodeAllocator, NodeDList, &m_nodeAllocator);
    }
    fastScannedRegExpNodes->Append(pnode);
}